

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O1

cpu_set_t * cpus_allowed(size_t *setsize,int *maxcpu)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  cpu_set_t *pcVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  ulong uVar12;
  
  __s = status_entry("Cpus_allowed");
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    sVar4 = strlen(__s);
    uVar3 = (int)sVar4 - 1;
    if ((int)uVar3 < 0) {
      iVar9 = -1;
    }
    else {
      iVar8 = 0;
      iVar9 = -1;
      lVar6 = (ulong)uVar3 + 1;
      do {
        bVar1 = __s[lVar6 + -1];
        bVar11 = bVar1 - 0x3a;
        if (0xf5 < bVar11 || 0xf9 < (byte)(bVar1 + 0x99)) {
          if (bVar11 < 0xf6 && (byte)(bVar1 + 0x99) < 0xfa) goto LAB_0024f2f9;
          iVar10 = -0x30;
          if (bVar11 < 0xf6) {
            iVar10 = -0x57;
          }
          uVar3 = iVar10 + (uint)bVar1;
          if (uVar3 != 0) {
            iVar10 = 4;
            if ((uVar3 < 8) && (iVar10 = 3, uVar3 < 4)) {
              iVar10 = (uVar3 != 1) + 1;
            }
            if (iVar9 < iVar10 + iVar8) {
              iVar9 = iVar10 + iVar8;
            }
          }
          iVar8 = iVar8 + 4;
        }
        lVar7 = lVar6 + -1;
        bVar2 = 0 < lVar6;
        lVar6 = lVar7;
      } while (lVar7 != 0 && bVar2);
    }
    *maxcpu = iVar9;
    if ((iVar9 != -1) && (pcVar5 = __sched_cpualloc((long)(iVar9 + 1)), pcVar5 != (cpu_set_t *)0x0))
    {
      uVar12 = (long)*maxcpu + 0x40U >> 3 & 0xfffffffffffffff8;
      *setsize = uVar12;
      sVar4 = strlen(__s);
      uVar3 = (int)sVar4 - 1;
      if (-1 < (int)uVar3) {
        iVar9 = 0;
        lVar6 = (ulong)uVar3 + 1;
        do {
          bVar1 = __s[lVar6 + -1];
          bVar11 = bVar1 - 0x3a;
          if (0xf5 < bVar11 || 0xf9 < (byte)(bVar1 + 0x99)) {
            if (bVar11 < 0xf6 && (byte)(bVar1 + 0x99) < 0xfa) {
LAB_0024f2f9:
              abort();
            }
            uVar3 = bVar1 - 0x57;
            if (0xf5 < bVar11) {
              uVar3 = bVar1 - 0x30;
            }
            if (((uVar3 & 1) != 0) && ((ulong)(long)iVar9 >> 3 < uVar12)) {
              pcVar5->__bits[(ulong)(long)iVar9 >> 6] =
                   pcVar5->__bits[(ulong)(long)iVar9 >> 6] | 1L << ((byte)iVar9 & 0x3f);
            }
            if ((uVar3 & 2) != 0) {
              iVar8 = iVar9 + 1;
              if ((ulong)(long)iVar8 >> 3 < uVar12) {
                pcVar5->__bits[(ulong)(long)iVar8 >> 6] =
                     pcVar5->__bits[(ulong)(long)iVar8 >> 6] | 1L << ((byte)iVar8 & 0x3f);
              }
            }
            if ((uVar3 & 4) != 0) {
              iVar8 = iVar9 + 2;
              if ((ulong)(long)iVar8 >> 3 < uVar12) {
                pcVar5->__bits[(ulong)(long)iVar8 >> 6] =
                     pcVar5->__bits[(ulong)(long)iVar8 >> 6] | 1L << ((byte)iVar8 & 0x3f);
              }
            }
            if (7 < uVar3) {
              iVar8 = iVar9 + 3;
              if ((ulong)(long)iVar8 >> 3 < uVar12) {
                pcVar5->__bits[(ulong)(long)iVar8 >> 6] =
                     pcVar5->__bits[(ulong)(long)iVar8 >> 6] | 1L << ((byte)iVar8 & 0x3f);
              }
            }
            iVar9 = iVar9 + 4;
          }
          lVar7 = lVar6 + -1;
          bVar2 = 0 < lVar6;
          lVar6 = lVar7;
        } while (lVar7 != 0 && bVar2);
      }
      goto LAB_0024f2e2;
    }
  }
  pcVar5 = (cpu_set_t *)0x0;
LAB_0024f2e2:
  free(__s);
  return (cpu_set_t *)pcVar5;
}

Assistant:

cpu_set_t *
cpus_allowed(size_t *setsize, int *maxcpu)
{
	cpu_set_t *c = NULL;
	char *allowed = status_entry("Cpus_allowed");
	if (!allowed || strlen(allowed) == 0)
		goto done;
	*maxcpu = high_bit_order(allowed);
	if (*maxcpu == -1)
		goto done;
	c = CPU_ALLOC(*maxcpu+1);
	if (!c)
		goto done;
	*setsize = CPU_ALLOC_SIZE(*maxcpu+1);
	set_cpu_bits(allowed, c, *setsize);
done:
	free(allowed);
	return c;
}